

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O3

size_t __thiscall
CCharmapToLocalUTF8::map_utf8
          (CCharmapToLocalUTF8 *this,char *dest,size_t dest_len,utf8_ptr src,size_t src_byte_len,
          size_t *src_bytes_used)

{
  size_t __n;
  size_t sVar1;
  
  if (dest == (char *)0x0) {
    if (src_bytes_used == (size_t *)0x0) {
      return src_byte_len;
    }
    __n = 0;
  }
  else {
    __n = src_byte_len;
    if (dest_len < src_byte_len) {
      sVar1 = dest_len;
      if (dest_len == 0) {
        __n = 0;
      }
      else {
        do {
          __n = sVar1;
          if ((byte)((byte)src.p_[__n] >> 7 & ~((byte)src.p_[__n] >> 6)) == 0) break;
          sVar1 = __n - 1;
          __n = dest_len;
        } while (sVar1 != 0);
      }
    }
    memcpy(dest,src.p_,__n);
    src_byte_len = __n;
    if (src_bytes_used == (size_t *)0x0) {
      return __n;
    }
  }
  *src_bytes_used = __n;
  return src_byte_len;
}

Assistant:

size_t CCharmapToLocalUTF8::map_utf8(char *dest, size_t dest_len,
                                     utf8_ptr src, size_t src_byte_len,
                                     size_t *src_bytes_used) const
{
    /* 
     *   if they didn't give us a destination buffer, tell them how much
     *   space is needed for the copy - this is identical to the length of
     *   the source string since we make no changes to it 
     */
    if (dest == 0)
    {
        if (src_bytes_used != 0)
            *src_bytes_used = 0;
        return src_byte_len;
    }

    /* assume we'll be able to copy the whole string */
    size_t copy_len = src_byte_len;

    /* if there's not enough space for the whole string, limit it */
    if (copy_len > dest_len)
    {
        /* copy no more than the output buffer length */
        copy_len = dest_len;

        /* 
         *   If this splits a character into two pieces, back up until we're
         *   at a character boundary - that is, the first byte of the next
         *   chunk is a non-continuation character.
         */
        while (copy_len > 0
               && utf8_ptr::s_is_continuation(src.getptr() + copy_len))
            --copy_len;

        /* 
         *   If that left us with zero bytes, just do the partial copy to
         *   ensure we don't get stuck in a zero-at-a-time infinite loop.
         */
        if (copy_len == 0)
            copy_len = dest_len;
    }

    /* if we have an output buffer, copy the data */
    if (dest != 0)
        memcpy(dest, src.getptr(), copy_len);

    /* set the amount we copied, if the caller is interested */
    if (src_bytes_used != 0)
        *src_bytes_used = copy_len;

    /* return the number of bytes we put in the destination buffer */
    return copy_len;
}